

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_dens_longform<double,double>
                 (double *x,size_t *ix_arr,size_t st,size_t end,double *split_point,size_t *split_ix
                 )

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double __y;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  double __x;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  
  if (end < st || end - st == 0) {
    dVar13 = -INFINITY;
  }
  else {
    dVar3 = x[ix_arr[st]];
    dVar4 = x[ix_arr[end]];
    lVar1 = (end - st) + 1;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    dVar12 = dVar4 - dVar3;
    dVar13 = -INFINITY;
    lVar7 = 0;
    dVar10 = dVar3;
    do {
      __y = x[(ix_arr + st)[lVar7 + 1]];
      if ((dVar10 != __y) || (NAN(dVar10) || NAN(__y))) {
        __x = (__y - dVar10) * 0.5 + dVar10;
        if ((__y <= __x) && ((__x = nextafter(__x,__y), __x <= dVar10 || (__y <= __x)))) {
          __x = dVar10;
        }
        auVar14._0_8_ = __x - dVar3;
        auVar14._8_8_ = dVar4 - __x;
        if (((auVar14._0_8_ != 0.0) || (NAN(auVar14._0_8_))) &&
           ((auVar14._8_8_ != 0.0 || (NAN(auVar14._8_8_))))) {
          lVar2 = lVar7 + 1;
          auVar9._8_4_ = (int)((ulong)lVar2 >> 0x20);
          auVar9._0_8_ = lVar2;
          auVar9._12_4_ = 0x45300000;
          auVar6._8_8_ = 0x10000000000000;
          auVar6._0_8_ = 0x10000000000000;
          auVar14 = maxpd(auVar14,auVar6);
          auVar5._8_8_ = dVar12;
          auVar5._0_8_ = dVar12;
          auVar14 = divpd(auVar14,auVar5);
          dVar10 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) /
                   ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0));
          auVar11._0_8_ = dVar10 * dVar10;
          auVar11._8_8_ = (1.0 - dVar10) * (1.0 - dVar10);
          auVar14 = divpd(auVar11,auVar14);
          dVar10 = auVar14._8_8_ + auVar14._0_8_;
          if (((!NAN(dVar10)) && (ABS(dVar10) != INFINITY)) && (dVar13 < dVar10)) {
            *split_point = __x;
            *split_ix = st + lVar7;
            dVar13 = dVar10;
          }
        }
      }
      lVar7 = lVar7 + 1;
      dVar10 = __y;
    } while ((st - end) + lVar7 != 0);
  }
  return dVar13;
}

Assistant:

double find_split_dens_longform(real_t *restrict x, size_t *restrict ix_arr, size_t st, size_t end,
                                double &restrict split_point, size_t &restrict split_ix)
{
    double best_gain = -HUGE_VAL;
    real_t xmin = x[ix_arr[st]];
    real_t xmax = x[ix_arr[end]];
    real_t xleft, xright;
    real_t xmid;
    ldouble_safe pct_left, pct_right;
    ldouble_safe rpct_left, rpct_right;
    ldouble_safe n_tot = end - st + 1;
    ldouble_safe xtot = (ldouble_safe)xmax - (ldouble_safe)xmin;
    ldouble_safe cnt_left;
    double this_gain;

    for (size_t row = st; row < end; row++)
    {
        if (x[ix_arr[row]] == x[ix_arr[row+1]]) continue;
        xmid = midpoint(x[ix_arr[row]], x[ix_arr[row+1]]);
        xleft = xmid - xmin;
        xright = xmax - xmid;
        if (unlikely(!xleft || !xright)) continue;

        cnt_left = (ldouble_safe)(row-st+1);

        xleft = std::fmax(xleft, (real_t)std::numeric_limits<real_t>::min());
        xright = std::fmax(xright, (real_t)std::numeric_limits<real_t>::min());
        pct_left = cnt_left / n_tot;
        pct_right = (ldouble_safe)1 - pct_left;
        rpct_left = (ldouble_safe)xleft / xtot;
        rpct_right = (ldouble_safe)xright / xtot;

        this_gain = square(pct_left) / rpct_left + square(pct_right) / rpct_right;
        if (unlikely(is_na_or_inf(this_gain))) continue;
        if (this_gain > best_gain)
        {
            best_gain = this_gain;
            split_point = xmid;
            split_ix = row;
        }
    }

    return best_gain;
}